

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3GetInt32(char *zNum,int *pValue)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  long lVar6;
  byte *pbVar7;
  uint uVar8;
  long lVar9;
  
  bVar1 = *zNum;
  if (bVar1 == 0x2d) {
    zNum = zNum + 1;
    lVar4 = -1;
  }
  else {
    if (bVar1 == 0x30) {
      if (((byte)(zNum[1] | 0x20U) == 0x78) && ((""[(byte)zNum[2]] & 8) != 0)) {
        pbVar7 = (byte *)(zNum + 1);
        do {
          pbVar2 = pbVar7 + 1;
          pbVar7 = pbVar7 + 1;
        } while (*pbVar2 == 0x30);
        lVar4 = 0;
        uVar8 = 0;
        pbVar2 = pbVar7;
        do {
          bVar1 = *pbVar2;
          if ((""[bVar1] & 8) == 0) goto LAB_0015bebc;
          uVar8 = (uint)(((char)(bVar1 * '\x02') >> 7 & 9U) + bVar1 & 0xf) | uVar8 << 4;
          lVar4 = lVar4 + 1;
          pbVar2 = pbVar2 + 1;
        } while (lVar4 != 8);
        lVar4 = 8;
LAB_0015bebc:
        iVar3 = 0;
        if ((-1 < (int)uVar8) && ((""[pbVar7[lVar4]] & 8) == 0)) {
          *pValue = uVar8;
LAB_0015be64:
          iVar3 = 1;
        }
        return iVar3;
      }
    }
    else {
      if (bVar1 != 0x2b) {
        lVar4 = 0;
        bVar5 = bVar1;
        goto LAB_0015bdf4;
      }
      zNum = zNum + 1;
    }
    lVar4 = 0;
  }
  bVar5 = *zNum;
LAB_0015bdf4:
  if (0xfffffffffffffff5 < (ulong)bVar5 - 0x3a) {
    while (bVar5 == 0x30) {
      bVar5 = ((byte *)zNum)[1];
      zNum = (char *)((byte *)zNum + 1);
    }
    lVar9 = 0;
    lVar6 = 0;
    do {
      if (9 < (byte)(((byte *)zNum)[lVar9] - 0x30)) {
        if (0x7fffffff < lVar4 + lVar6) {
          return 0;
        }
        iVar3 = -(int)lVar6;
        if (bVar1 != 0x2d) {
          iVar3 = (int)lVar6;
        }
        *pValue = iVar3;
        goto LAB_0015be64;
      }
      lVar6 = (ulong)(((byte *)zNum)[lVar9] & 0xf) + lVar6 * 10;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0xb);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetInt32(const char *zNum, int *pValue){
  sqlite_int64 v = 0;
  int i, c;
  int neg = 0;
  if( zNum[0]=='-' ){
    neg = 1;
    zNum++;
  }else if( zNum[0]=='+' ){
    zNum++;
  }
#ifndef SQLITE_OMIT_HEX_INTEGER
  else if( zNum[0]=='0'
        && (zNum[1]=='x' || zNum[1]=='X')
        && sqlite3Isxdigit(zNum[2])
  ){
    u32 u = 0;
    zNum += 2;
    while( zNum[0]=='0' ) zNum++;
    for(i=0; i<8 && sqlite3Isxdigit(zNum[i]); i++){
      u = u*16 + sqlite3HexToInt(zNum[i]);
    }
    if( (u&0x80000000)==0 && sqlite3Isxdigit(zNum[i])==0 ){
      memcpy(pValue, &u, 4);
      return 1;
    }else{
      return 0;
    }
  }
#endif
  if( !sqlite3Isdigit(zNum[0]) ) return 0;
  while( zNum[0]=='0' ) zNum++;
  for(i=0; i<11 && (c = zNum[i] - '0')>=0 && c<=9; i++){
    v = v*10 + c;
  }

  /* The longest decimal representation of a 32 bit integer is 10 digits:
  **
  **             1234567890
  **     2^31 -> 2147483648
  */
  testcase( i==10 );
  if( i>10 ){
    return 0;
  }
  testcase( v-neg==2147483647 );
  if( v-neg>2147483647 ){
    return 0;
  }
  if( neg ){
    v = -v;
  }
  *pValue = (int)v;
  return 1;
}